

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_generate
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag,size_t input_index,uchar *input_blinding_key
              ,uchar *output_blinding_key)

{
  secp256k1_generator *psVar1;
  secp256k1_surjectionproof *psVar2;
  secp256k1_generator *n_input_tags;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  void *pvVar6;
  char *pcVar7;
  secp256k1_scalar *psVar8;
  bool bVar9;
  size_t *ring_input_index_00;
  int overflow;
  int local_a16c;
  size_t ring_input_index;
  secp256k1_surjectionproof *local_a160;
  secp256k1_generator *local_a158;
  secp256k1_generator *local_a150;
  size_t indices [1];
  size_t rsizes [1];
  secp256k1_scalar blinding_key;
  secp256k1_scalar tmps;
  uchar sec_input [36];
  uchar msg32 [32];
  secp256k1_scalar nonce;
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  
  overflow = 0;
  ring_input_index = 0;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (proof == (secp256k1_surjectionproof *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "proof != NULL";
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "ephemeral_input_tags != NULL";
  }
  else if (ephemeral_output_tag == (secp256k1_generator *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "ephemeral_output_tag != NULL";
  }
  else if (input_blinding_key == (uchar *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "input_blinding_key != NULL";
  }
  else {
    if (output_blinding_key != (uchar *)0x0) {
      local_a158 = (secp256k1_generator *)input_index;
      local_a150 = (secp256k1_generator *)n_ephemeral_input_tags;
      secp256k1_scalar_set_b32(&tmps,input_blinding_key,&overflow);
      if (overflow != 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&blinding_key,output_blinding_key,&overflow);
      if (overflow == 0) {
        if ((((tmps.d[0] == blinding_key.d[0]) && (tmps.d[1] == blinding_key.d[1])) &&
            (tmps.d[2] == blinding_key.d[2])) &&
           ((tmps.d[3] == blinding_key.d[3] &&
            (((tmps.d[1] != 0 || tmps.d[0] != 0) || tmps.d[2] != 0) || tmps.d[3] != 0)))) {
          return 0;
        }
        secp256k1_scalar_negate(&tmps,&tmps);
        secp256k1_scalar_add(&blinding_key,&blinding_key,&tmps);
        psVar1 = (secp256k1_generator *)proof->n_inputs;
        ring_input_index_00 = (size_t *)0x11d459;
        puVar4 = (uchar *)secp256k1_surjectionproof_n_used_inputs(ctx,proof);
        n_input_tags = local_a150;
        if (psVar1 != local_a150 || psVar1 < puVar4) {
          return 0;
        }
        local_a160 = proof;
        secp256k1_surjection_compute_public_keys
                  (ring_pubkeys,(size_t)ephemeral_input_tags,local_a150,(size_t)proof->used_inputs,
                   ephemeral_output_tag->data,local_a158,(size_t)&ring_input_index,
                   ring_input_index_00);
        rsizes[0] = (size_t)(int)puVar4;
        indices[0] = (size_t)(int)ring_input_index;
        secp256k1_surjection_genmessage
                  (msg32,ephemeral_input_tags,(size_t)n_input_tags,ephemeral_output_tag);
        secp256k1_scalar_get_b32(sec_input + 4,&blinding_key);
        psVar8 = borromean_s;
        puVar5 = (uchar *)0x0;
        do {
          psVar2 = local_a160;
          if (puVar4 == puVar5) {
            nonce.d[0] = borromean_s[ring_input_index].d[0];
            nonce.d[1] = borromean_s[ring_input_index].d[1];
            nonce.d[2] = borromean_s[ring_input_index].d[2];
            nonce.d[3] = borromean_s[ring_input_index].d[3];
            borromean_s[ring_input_index].d[0] = 0;
            borromean_s[ring_input_index].d[1] = 0;
            borromean_s[ring_input_index].d[2] = 0;
            borromean_s[ring_input_index].d[3] = 0;
            psVar8 = borromean_s;
            iVar3 = secp256k1_borromean_sign
                              (&ctx->ecmult_gen_ctx,local_a160->data,psVar8,ring_pubkeys,&nonce,
                               &blinding_key,rsizes,indices,1,msg32,0x20);
            if (iVar3 == 0) {
              return 0;
            }
            puVar5 = psVar2->data;
            while( true ) {
              puVar5 = puVar5 + 0x20;
              bVar9 = (secp256k1_generator *)puVar4 == (secp256k1_generator *)0x0;
              puVar4 = puVar4 + -1;
              if (bVar9) break;
              secp256k1_scalar_get_b32(puVar5,psVar8);
              psVar8 = psVar8 + 1;
            }
            return 1;
          }
          local_a16c = 0;
          sec_input[0] = (uchar)puVar5;
          sec_input[1] = (uchar)((ulong)puVar5 >> 8);
          sec_input[2] = (uchar)((ulong)puVar5 >> 0x10);
          sec_input[3] = (uchar)((ulong)puVar5 >> 0x18);
          nonce.d[0] = 0xbb67ae856a09e667;
          nonce.d[1] = 0xa54ff53a3c6ef372;
          nonce.d[2] = 0x9b05688c510e527f;
          nonce.d[3] = 0x5be0cd191f83d9ab;
          secp256k1_sha256_write((secp256k1_sha256 *)&nonce,sec_input,0x24);
          secp256k1_sha256_finalize((secp256k1_sha256 *)&nonce,sec_input);
          secp256k1_scalar_set_b32(psVar8,sec_input,&local_a16c);
          puVar5 = puVar5 + 1;
          psVar8 = psVar8 + 1;
        } while (local_a16c != 1);
        return 0;
      }
      return 0;
    }
    pvVar6 = (ctx->illegal_callback).data;
    pcVar7 = "output_blinding_key != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar7,pvVar6);
  return 0;
}

Assistant:

int secp256k1_surjectionproof_generate(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag, size_t input_index, const unsigned char *input_blinding_key, const unsigned char *output_blinding_key) {
    secp256k1_scalar blinding_key;
    secp256k1_scalar tmps;
    secp256k1_scalar nonce;
    int overflow = 0;
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t indices[1];   /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    size_t ring_input_index = 0;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);
    ARG_CHECK(input_blinding_key != NULL);
    ARG_CHECK(output_blinding_key != NULL);
#ifdef VERIFY
    CHECK(proof->initialized == 1);
#endif

    /* Compute secret key */
    secp256k1_scalar_set_b32(&tmps, input_blinding_key, &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_scalar_set_b32(&blinding_key, output_blinding_key, &overflow);
    if (overflow) {
        return 0;
    }
    /* The only time the input may equal the output is if neither one was blinded in the first place,
     * i.e. both blinding keys are zero. Otherwise this is a privacy leak. */
    if (secp256k1_scalar_eq(&tmps, &blinding_key) && !secp256k1_scalar_is_zero(&blinding_key)) {
        return 0;
    }
    secp256k1_scalar_negate(&tmps, &tmps);
    secp256k1_scalar_add(&blinding_key, &blinding_key, &tmps);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, input_index, &ring_input_index) == 0) {
        return 0;
    }

    /* Produce signature */
    rsizes[0] = (int) n_used_pubkeys;
    indices[0] = (int) ring_input_index;
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    if (secp256k1_surjection_genrand(borromean_s, n_used_pubkeys, &blinding_key) == 0) {
        return 0;
    }
    /* Borromean sign will overwrite one of the s values we just generated, so use
     * it as a nonce instead. This avoids extra random generation and also is an
     * homage to the rangeproof code which does this very cleverly to encode messages. */
    nonce = borromean_s[ring_input_index];
    secp256k1_scalar_clear(&borromean_s[ring_input_index]);
    if (secp256k1_borromean_sign(&ctx->ecmult_gen_ctx, &proof->data[0], borromean_s, ring_pubkeys, &nonce, &blinding_key, rsizes, indices, 1, msg32, 32) == 0) {
        return 0;
    }
    for (i = 0; i < n_used_pubkeys; i++) {
        secp256k1_scalar_get_b32(&proof->data[32 + 32 * i], &borromean_s[i]);
    }
    return 1;
}